

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageFieldNoLabel
          (Parser *this,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *field_location,FileDescriptorProto *containing_file)

{
  bool bVar1;
  FieldDescriptorProto_Type FVar2;
  int path_component;
  ulong uVar3;
  Token *pTVar4;
  string *psVar5;
  DescriptorProto *this_00;
  char *pcVar6;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  undefined1 local_210 [8];
  LocationRecorder location_4;
  LocationRecorder location_3;
  DescriptorProto *group;
  LocationRecorder group_location;
  undefined1 local_1d0 [4];
  int number;
  LocationRecorder location_2;
  LocationRecorder location_1;
  Token name_token;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  uint local_100;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string type_name;
  bool local_ad;
  Type type;
  bool type_parsed;
  undefined1 local_a0 [8];
  LocationRecorder location;
  MapField map_field;
  LocationRecorder *field_location_local;
  int location_field_number_for_nested_type_local;
  LocationRecorder *parent_location_local;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages_local;
  FieldDescriptorProto *field_local;
  Parser *this_local;
  
  map_field.value_type_name.field_2._8_8_ = field_location;
  MapField::MapField((MapField *)&location.location_);
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)local_a0,
             (LocationRecorder *)map_field.value_type_name.field_2._8_8_);
  LocationRecorder::RecordLegacyLocation((LocationRecorder *)local_a0,&field->super_Message,TYPE);
  local_ad = false;
  type_name.field_2._12_4_ = 5;
  std::__cxx11::string::string((string *)local_d8);
  bVar1 = TryConsume(this,"map");
  if (bVar1) {
    local_ad = LookingAt(this,"<");
    if (local_ad) {
      location.location_._0_1_ = 1;
    }
    else {
      std::__cxx11::string::operator=((string *)local_d8,"map");
    }
    local_ad = !local_ad;
  }
  if (((byte)location.location_ & 1) == 0) {
    bVar1 = FieldDescriptorProto::has_label(field);
    if ((!bVar1) && (bVar1 = DefaultToOptionalFields(this), bVar1)) {
      FieldDescriptorProto::set_label(field,FieldDescriptorProto_Label_LABEL_OPTIONAL);
    }
    bVar1 = FieldDescriptorProto::has_label(field);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"Expected \"required\", \"optional\", or \"repeated\".",
                 (allocator<char> *)&name_token.field_0x37);
      AddError(this,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&name_token.field_0x37);
      FieldDescriptorProto::set_label(field,FieldDescriptorProto_Label_LABEL_OPTIONAL);
    }
    if ((local_ad) ||
       (bVar1 = ParseType(this,(Type *)(type_name.field_2._M_local_buf + 0xc),(string *)local_d8),
       bVar1)) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        LocationRecorder::AddPath((LocationRecorder *)local_a0,6);
        FieldDescriptorProto::set_type_name(field,(string *)local_d8);
      }
      else {
        LocationRecorder::AddPath((LocationRecorder *)local_a0,5);
        FieldDescriptorProto::set_type(field,type_name.field_2._12_4_);
      }
LAB_004c1f5c:
      local_100 = 0;
    }
    else {
      this_local._7_1_ = 0;
      local_100 = 1;
    }
  }
  else {
    bVar1 = FieldDescriptorProto::has_oneof_index(field);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Map fields are not allowed in oneofs.",&local_f9);
      AddError(this,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator(&local_f9);
      this_local._7_1_ = 0;
      local_100 = 1;
    }
    else {
      bVar1 = FieldDescriptorProto::has_label(field);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,
                   "Field labels (required/optional/repeated) are not allowed on map fields.",
                   &local_121);
        AddError(this,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator(&local_121);
        this_local._7_1_ = 0;
        local_100 = 1;
      }
      else {
        bVar1 = FieldDescriptorProto::has_extendee(field);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_148,"Map fields are not allowed to be extensions.",&local_149)
          ;
          AddError(this,&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          std::allocator<char>::~allocator(&local_149);
          this_local._7_1_ = 0;
          local_100 = 1;
        }
        else {
          FieldDescriptorProto::set_label(field,FieldDescriptorProto_Label_LABEL_REPEATED);
          bVar1 = Consume(this,"<");
          if (bVar1) {
            bVar1 = ParseType(this,(Type *)((long)&location.location_ + 4),
                              (string *)&map_field.value_type);
            if (bVar1) {
              bVar1 = Consume(this,",");
              if (bVar1) {
                bVar1 = ParseType(this,(Type *)&map_field,
                                  (string *)((long)&map_field.key_type_name.field_2 + 8));
                if (bVar1) {
                  bVar1 = Consume(this,">");
                  if (bVar1) {
                    LocationRecorder::AddPath((LocationRecorder *)local_a0,6);
                    goto LAB_004c1f5c;
                  }
                  this_local._7_1_ = 0;
                  local_100 = 1;
                }
                else {
                  this_local._7_1_ = 0;
                  local_100 = 1;
                }
              }
              else {
                this_local._7_1_ = 0;
                local_100 = 1;
              }
            }
            else {
              this_local._7_1_ = 0;
              local_100 = 1;
            }
          }
          else {
            this_local._7_1_ = 0;
            local_100 = 1;
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_d8);
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_a0);
  if (local_100 != 0) goto LAB_004c2769;
  pTVar4 = io::Tokenizer::current(this->input_);
  io::Tokenizer::Token::Token((Token *)&location_1.location_,pTVar4);
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)&location_2.location_,
             (LocationRecorder *)map_field.value_type_name.field_2._8_8_,1);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)&location_2.location_,&field->super_Message,NAME);
  psVar5 = FieldDescriptorProto::mutable_name_abi_cxx11_(field);
  bVar1 = ConsumeIdentifier(this,psVar5,"Expected field name.");
  if (!bVar1) {
    this_local._7_1_ = 0;
  }
  local_100 = (uint)!bVar1;
  LocationRecorder::~LocationRecorder((LocationRecorder *)&location_2.location_);
  if (local_100 == 0) {
    bVar1 = Consume(this,"=","Missing field number.");
    if (bVar1) {
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_1d0,
                 (LocationRecorder *)map_field.value_type_name.field_2._8_8_,3);
      LocationRecorder::RecordLegacyLocation
                ((LocationRecorder *)local_1d0,&field->super_Message,NUMBER);
      bVar1 = ConsumeInteger(this,(int *)((long)&group_location.location_ + 4),
                             "Expected field number.");
      if (bVar1) {
        FieldDescriptorProto::set_number(field,group_location.location_._4_4_);
      }
      else {
        this_local._7_1_ = 0;
      }
      local_100 = (uint)!bVar1;
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_1d0);
      if (local_100 == 0) {
        bVar1 = ParseFieldOptions(this,field,
                                  (LocationRecorder *)map_field.value_type_name.field_2._8_8_,
                                  containing_file);
        if (bVar1) {
          bVar1 = FieldDescriptorProto::has_type(field);
          if ((bVar1) &&
             (FVar2 = FieldDescriptorProto::type(field),
             FVar2 == FieldDescriptorProto_Type_TYPE_GROUP)) {
            LocationRecorder::LocationRecorder((LocationRecorder *)&group,parent_location);
            LocationRecorder::StartAt
                      ((LocationRecorder *)&group,
                       (LocationRecorder *)map_field.value_type_name.field_2._8_8_);
            LocationRecorder::AddPath
                      ((LocationRecorder *)&group,location_field_number_for_nested_type);
            path_component = RepeatedPtrField<google::protobuf::DescriptorProto>::size(messages);
            LocationRecorder::AddPath((LocationRecorder *)&group,path_component);
            this_00 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(messages);
            psVar5 = FieldDescriptorProto::name_abi_cxx11_(field);
            DescriptorProto::set_name(this_00,psVar5);
            LocationRecorder::LocationRecorder
                      ((LocationRecorder *)&location_4.location_,(LocationRecorder *)&group,1);
            LocationRecorder::StartAt
                      ((LocationRecorder *)&location_4.location_,(Token *)&location_1.location_);
            LocationRecorder::EndAt
                      ((LocationRecorder *)&location_4.location_,(Token *)&location_1.location_);
            LocationRecorder::RecordLegacyLocation
                      ((LocationRecorder *)&location_4.location_,&this_00->super_Message,NAME);
            LocationRecorder::~LocationRecorder((LocationRecorder *)&location_4.location_);
            LocationRecorder::LocationRecorder
                      ((LocationRecorder *)local_210,
                       (LocationRecorder *)map_field.value_type_name.field_2._8_8_,6);
            LocationRecorder::StartAt((LocationRecorder *)local_210,(Token *)&location_1.location_);
            LocationRecorder::EndAt((LocationRecorder *)local_210,(Token *)&location_1.location_);
            LocationRecorder::~LocationRecorder((LocationRecorder *)local_210);
            psVar5 = DescriptorProto::name_abi_cxx11_(this_00);
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)psVar5);
            if (*pcVar6 < 'A') {
LAB_004c2406:
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_230,"Group names must start with a capital letter.",
                         &local_231);
              AddError(this,name_token.text.field_2._8_4_,name_token.text.field_2._12_4_,&local_230)
              ;
              std::__cxx11::string::~string((string *)&local_230);
              std::allocator<char>::~allocator(&local_231);
            }
            else {
              psVar5 = DescriptorProto::name_abi_cxx11_(this_00);
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)psVar5);
              if ('Z' < *pcVar6) goto LAB_004c2406;
            }
            psVar5 = FieldDescriptorProto::mutable_name_abi_cxx11_(field);
            LowerString(psVar5);
            psVar5 = DescriptorProto::name_abi_cxx11_(this_00);
            FieldDescriptorProto::set_type_name(field,psVar5);
            bVar1 = LookingAt(this,"{");
            if (bVar1) {
              bVar1 = ParseMessageBlock(this,this_00,(LocationRecorder *)&group,containing_file);
              if (bVar1) {
                local_100 = 0;
              }
              else {
                this_local._7_1_ = 0;
                local_100 = 1;
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_258,"Missing group body.",&local_259);
              AddError(this,&local_258);
              std::__cxx11::string::~string((string *)&local_258);
              std::allocator<char>::~allocator(&local_259);
              this_local._7_1_ = 0;
              local_100 = 1;
            }
            LocationRecorder::~LocationRecorder((LocationRecorder *)&group);
            if (local_100 != 0) goto LAB_004c274d;
          }
          else {
            bVar1 = ConsumeEndOfDeclaration
                              (this,";",(LocationRecorder *)map_field.value_type_name.field_2._8_8_)
            ;
            if (!bVar1) {
              this_local._7_1_ = 0;
              local_100 = 1;
              goto LAB_004c274d;
            }
          }
          if (((byte)location.location_ & 1) != 0) {
            GenerateMapEntry(this,(MapField *)&location.location_,field,messages);
          }
          this_local._7_1_ = 1;
          local_100 = 1;
        }
        else {
          this_local._7_1_ = 0;
          local_100 = 1;
        }
      }
    }
    else {
      this_local._7_1_ = 0;
      local_100 = 1;
    }
  }
LAB_004c274d:
  io::Tokenizer::Token::~Token((Token *)&location_1.location_);
LAB_004c2769:
  MapField::~MapField((MapField *)&location.location_);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseMessageFieldNoLabel(
    FieldDescriptorProto* field,
    RepeatedPtrField<DescriptorProto>* messages,
    const LocationRecorder& parent_location,
    int location_field_number_for_nested_type,
    const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  MapField map_field;
  // Parse type.
  {
    LocationRecorder location(field_location);  // add path later
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::TYPE);

    bool type_parsed = false;
    FieldDescriptorProto::Type type = FieldDescriptorProto::TYPE_INT32;
    string type_name;

    // Special case map field. We only treat the field as a map field if the
    // field type name starts with the word "map" with a following "<".
    if (TryConsume("map")) {
      if (LookingAt("<")) {
        map_field.is_map_field = true;
      } else {
        // False positive
        type_parsed = true;
        type_name = "map";
      }
    }
    if (map_field.is_map_field) {
      if (field->has_oneof_index()) {
        AddError("Map fields are not allowed in oneofs.");
        return false;
      }
      if (field->has_label()) {
        AddError(
            "Field labels (required/optional/repeated) are not allowed on "
            "map fields.");
        return false;
      }
      if (field->has_extendee()) {
        AddError("Map fields are not allowed to be extensions.");
        return false;
      }
      field->set_label(FieldDescriptorProto::LABEL_REPEATED);
      DO(Consume("<"));
      DO(ParseType(&map_field.key_type, &map_field.key_type_name));
      DO(Consume(","));
      DO(ParseType(&map_field.value_type, &map_field.value_type_name));
      DO(Consume(">"));
      // Defer setting of the type name of the map field until the
      // field name is parsed. Add the source location though.
      location.AddPath(FieldDescriptorProto::kTypeNameFieldNumber);
    } else {
      // Handle the case where no explicit label is given for a non-map field.
      if (!field->has_label() && DefaultToOptionalFields()) {
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }
      if (!field->has_label()) {
        AddError("Expected \"required\", \"optional\", or \"repeated\".");
        // We can actually reasonably recover here by just assuming the user
        // forgot the label altogether.
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }

      // Handle the case where the actual type is a message or enum named "map",
      // which we already consumed in the code above.
      if (!type_parsed) {
        DO(ParseType(&type, &type_name));
      }
      if (type_name.empty()) {
        location.AddPath(FieldDescriptorProto::kTypeFieldNumber);
        field->set_type(type);
      } else {
        location.AddPath(FieldDescriptorProto::kTypeNameFieldNumber);
        field->set_type_name(type_name);
      }
    }
  }

  // Parse name and '='.
  io::Tokenizer::Token name_token = input_->current();
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(field->mutable_name(), "Expected field name."));
  }
  DO(Consume("=", "Missing field number."));

  // Parse field number.
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNumberFieldNumber);
    location.RecordLegacyLocation(
        field, DescriptorPool::ErrorCollector::NUMBER);
    int number;
    DO(ConsumeInteger(&number, "Expected field number."));
    field->set_number(number);
  }

  // Parse options.
  DO(ParseFieldOptions(field, field_location, containing_file));

  // Deal with groups.
  if (field->has_type() && field->type() == FieldDescriptorProto::TYPE_GROUP) {
    // Awkward:  Since a group declares both a message type and a field, we
    //   have to create overlapping locations.
    LocationRecorder group_location(parent_location);
    group_location.StartAt(field_location);
    group_location.AddPath(location_field_number_for_nested_type);
    group_location.AddPath(messages->size());

    DescriptorProto* group = messages->Add();
    group->set_name(field->name());

    // Record name location to match the field name's location.
    {
      LocationRecorder location(group_location,
                                DescriptorProto::kNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
      location.RecordLegacyLocation(
          group, DescriptorPool::ErrorCollector::NAME);
    }

    // The field's type_name also comes from the name.  Confusing!
    {
      LocationRecorder location(field_location,
                                FieldDescriptorProto::kTypeNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
    }

    // As a hack for backwards-compatibility, we force the group name to start
    // with a capital letter and lower-case the field name.  New code should
    // not use groups; it should use nested messages.
    if (group->name()[0] < 'A' || 'Z' < group->name()[0]) {
      AddError(name_token.line, name_token.column,
        "Group names must start with a capital letter.");
    }
    LowerString(field->mutable_name());

    field->set_type_name(group->name());
    if (LookingAt("{")) {
      DO(ParseMessageBlock(group, group_location, containing_file));
    } else {
      AddError("Missing group body.");
      return false;
    }
  } else {
    DO(ConsumeEndOfDeclaration(";", &field_location));
  }

  // Create a map entry type if this is a map field.
  if (map_field.is_map_field) {
    GenerateMapEntry(map_field, field, messages);
  }

  return true;
}